

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::Image::bindMemory
          (Image *this,MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *allocation)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  deUint64 dVar3;
  VkResult result;
  Handle<(vk::HandleType)9> *pHVar4;
  Allocation *pAVar5;
  VkDeviceMemory VVar6;
  VkDeviceSize VVar7;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *allocation_local;
  Image *this_local;
  
  pDVar1 = this->m_vk;
  pVVar2 = this->m_device;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_object).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar3 = pHVar4->m_internal;
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&allocation->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar6 = ::vk::Allocation::getMemory(pAVar5);
  pAVar5 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&allocation->
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  VVar7 = ::vk::Allocation::getOffset(pAVar5);
  result = (*pDVar1->_vptr_DeviceInterface[0xd])(pDVar1,pVVar2,dVar3,VVar6.m_internal,VVar7);
  ::vk::checkResult(result,
                    "m_vk.bindImageMemory(m_device, *m_object, allocation->getMemory(), allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x32d);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            (&this->m_allocation,allocation);
  return;
}

Assistant:

void Image::bindMemory (de::MovePtr<vk::Allocation> allocation)
{
	DE_ASSERT(allocation);
	VK_CHECK(m_vk.bindImageMemory(m_device, *m_object, allocation->getMemory(), allocation->getOffset()));

	DE_ASSERT(!m_allocation);
	m_allocation = allocation;
}